

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O3

void Imf_2_5::convertInPlace(char **writePtr,char **readPtr,PixelType type,size_t numPixels)

{
  char cVar1;
  size_t sVar2;
  ArgExc *this;
  long lVar3;
  char *pcVar4;
  undefined2 local_12;
  undefined4 local_10;
  undefined4 local_c;
  
  if (type == UINT) {
    if (numPixels != 0) {
      pcVar4 = *readPtr;
      sVar2 = 0;
      do {
        local_10 = *(undefined4 *)pcVar4;
        lVar3 = 0;
        do {
          cVar1 = *(char *)((long)&local_10 + lVar3);
          pcVar4 = *writePtr;
          *writePtr = pcVar4 + 1;
          *pcVar4 = cVar1;
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 != 4);
        pcVar4 = *readPtr + 4;
        *readPtr = pcVar4;
        sVar2 = sVar2 + 1;
      } while (sVar2 != numPixels);
    }
  }
  else if (type == HALF) {
    if (numPixels != 0) {
      pcVar4 = *readPtr;
      sVar2 = 0;
      do {
        local_12 = *(undefined2 *)pcVar4;
        lVar3 = 0;
        do {
          cVar1 = *(char *)((long)&local_12 + lVar3);
          pcVar4 = *writePtr;
          *writePtr = pcVar4 + 1;
          *pcVar4 = cVar1;
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 != 2);
        pcVar4 = *readPtr + 2;
        *readPtr = pcVar4;
        sVar2 = sVar2 + 1;
      } while (sVar2 != numPixels);
    }
  }
  else {
    if (type != FLOAT) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this,"Unknown pixel data type.");
      __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    if (numPixels != 0) {
      pcVar4 = *readPtr;
      sVar2 = 0;
      do {
        local_c = *(undefined4 *)pcVar4;
        lVar3 = 0;
        do {
          cVar1 = *(char *)((long)&local_c + lVar3);
          pcVar4 = *writePtr;
          *writePtr = pcVar4 + 1;
          *pcVar4 = cVar1;
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 != 4);
        pcVar4 = *readPtr + 4;
        *readPtr = pcVar4;
        sVar2 = sVar2 + 1;
      } while (sVar2 != numPixels);
    }
  }
  return;
}

Assistant:

void
convertInPlace (char *& writePtr,
                const char *& readPtr,
		PixelType type,
                size_t numPixels)
{
    switch (type)
    {
      case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
    
        for (size_t j = 0; j < numPixels; ++j)
        {
            Xdr::write <CharPtrIO> (writePtr, *(const unsigned int *) readPtr);
            readPtr += sizeof(unsigned int);
        }
        break;
    
      case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
    
        for (size_t j = 0; j < numPixels; ++j)
        {               
            Xdr::write <CharPtrIO> (writePtr, *(const half *) readPtr);
            readPtr += sizeof(half);
        }
        break;
    
      case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
    
        for (size_t j = 0; j < numPixels; ++j)
        {
            union bytesOrFloat tmp;
            tmp.b = * reinterpret_cast<const FBytes *>( readPtr );
            Xdr::write <CharPtrIO> (writePtr, tmp.f);
            readPtr += sizeof(float);
        }
        break;
    
      default:
    
        throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
    }
}